

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O1

uint Gia_Iso2ManCone_rec(Gia_Man_t *p,int Id,int Level)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  iVar10 = 0;
  while (Level != 0) {
    if (p->nTravIdsAlloc <= Id) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x22c,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[Id] == p->nTravIds) break;
    p->pTravIds[Id] = p->nTravIds;
    if (Id < 0) {
LAB_006c4ae6:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    iVar3 = p->nObjs;
    if (iVar3 <= Id) goto LAB_006c4ae6;
    pGVar6 = p->pObjs;
    pGVar1 = pGVar6 + (uint)Id;
    uVar7 = *(ulong *)pGVar1;
    uVar8 = (uint)uVar7;
    if (((int)uVar8 < 0) || ((uVar8 & 0x1fffffff) == 0x1fffffff)) {
      if ((uVar8 & 0x9fffffff) == 0x9fffffff) {
        uVar8 = (uint)(uVar7 >> 0x20);
        if ((int)(uVar8 & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
          uVar8 = pGVar1->Value;
          goto LAB_006c4a1a;
        }
        if (p->vCis->nSize - p->nRegs <= (int)(uVar8 & 0x1fffffff)) {
          iVar4 = p->vCis->nSize;
          if ((int)(uVar8 & 0x1fffffff) < iVar4 - p->nRegs) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar5 = p->vCos->nSize;
          uVar8 = (iVar5 - iVar4) + (uVar8 & 0x1fffffff);
          if (((int)uVar8 < 0) || (iVar5 <= (int)uVar8)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar4 = p->vCos->pArray[uVar8];
          if ((-1 < (long)iVar4) && (iVar4 < iVar3)) {
            pGVar2 = pGVar6 + iVar4 + -(ulong)((uint)*(undefined8 *)(pGVar6 + iVar4) & 0x1fffffff);
            if ((pGVar6 <= pGVar2) && (pGVar2 < pGVar6 + iVar3)) {
              uVar8 = pGVar1->Value;
              uVar9 = Gia_Iso2ManCone_rec(p,(int)((ulong)((long)pGVar2 - (long)pGVar6) >> 2) *
                                            -0x55555555,Level);
              return uVar8 + iVar10 + uVar9;
            }
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          goto LAB_006c4ae6;
        }
      }
      if ((~uVar7 & 0x1fffffff1fffffff) != 0) {
        __assert_fail("Gia_ObjIsConst0(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso2.c"
                      ,0xbb,"unsigned int Gia_Iso2ManCone_rec(Gia_Man_t *, int, int)");
      }
      uVar8 = pGVar1->Value;
      goto LAB_006c4a1a;
    }
    uVar9 = pGVar1->Value;
    Level = Level + -1;
    uVar8 = Gia_Iso2ManCone_rec(p,Id - (uVar8 & 0x1fffffff),Level);
    Id = Id - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff);
    iVar10 = uVar9 + iVar10 + uVar8;
  }
  uVar8 = 0;
LAB_006c4a1a:
  return uVar8 + iVar10;
}

Assistant:

unsigned Gia_Iso2ManCone_rec( Gia_Man_t * p, int Id, int Level )
{
    Gia_Obj_t * pObj;
    if ( Level == 0 )
        return 0;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
        return pObj->Value + Gia_Iso2ManCone_rec( p, Gia_ObjFaninId0(pObj, Id), Level-1 ) + Gia_Iso2ManCone_rec( p, Gia_ObjFaninId1(pObj, Id), Level-1 );
    if ( Gia_ObjIsPi(p, pObj) )
        return pObj->Value;
    if ( Gia_ObjIsRo(p, pObj) )
        return pObj->Value + Gia_Iso2ManCone_rec( p, Gia_ObjId(p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj))), Level );
    assert( Gia_ObjIsConst0(pObj) );
    return pObj->Value;
}